

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bzip2recover.c
# Opt level: O1

Int32 main(Int32 argc,Char **argv)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  FILE *pFVar8;
  BitStream *pBVar9;
  char *pcVar10;
  BitStream *bs;
  MaybeUInt64 MVar11;
  Int32 i;
  uint uVar12;
  ulong uVar13;
  Char *pCVar14;
  Int32 n;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  uint local_64;
  FILE *local_50;
  
  strncpy(progName,*argv,1999);
  progName[1999] = '\0';
  outFileName[0] = '\0';
  inFileName[0] = '\0';
  uVar13 = 1;
  fwrite("bzip2recover 1.0.6: extracts blocks from damaged .bz2 files.\n",0x3d,1,_stderr);
  if (argc == 2) {
    pcVar10 = argv[1];
    sVar7 = strlen(pcVar10);
    if (sVar7 < 0x7bc) {
      strcpy(inFileName,pcVar10);
      pFVar8 = fopen(inFileName,"rb");
      if (pFVar8 == (FILE *)0x0) {
        pcVar10 = "%s: can\'t read `%s\'\n";
      }
      else {
        pBVar9 = bsOpenReadStream((FILE *)pFVar8);
        uVar5 = 0;
        fprintf(_stderr,"%s: searching for block boundaries ...\n",progName);
        bStart[0] = 0;
        uVar3 = bsGetBit(pBVar9);
        if (uVar3 == 2) {
          iVar2 = 0;
          uVar17 = 0;
          local_64 = 0;
          uVar16 = 0;
        }
        else {
          uVar16 = 0;
          local_64 = 0;
          iVar2 = 0;
          uVar5 = 0;
          uVar17 = 0;
          do {
            uVar13 = uVar17;
            uVar17 = uVar13 + 1;
            uVar12 = local_64 << 1;
            uVar4 = uVar16 >> 0x1f;
            local_64 = uVar12 | uVar4;
            uVar16 = (uVar3 & 1) + uVar16 * 2;
            uVar4 = uVar12 & 0xffff | uVar4;
            if ((uVar16 == 0x59265359 && uVar4 == 0x3141) ||
               (uVar16 == 0x45385090 && uVar4 == 0x1772)) {
              MVar11 = uVar13 - 0x30;
              if (uVar17 < 0x32) {
                MVar11 = 0;
              }
              bEnd[(int)uVar5] = MVar11;
              iVar15 = iVar2;
              if ((0 < (int)uVar5) && (0x81 < bEnd[uVar5] - bStart[uVar5])) {
                iVar15 = iVar2 + 1;
                fprintf(_stderr,"   block %d runs from %Lu to %Lu\n");
                rbStart[iVar2] = bStart[uVar5];
                rbEnd[iVar2] = bEnd[uVar5];
              }
              if (49999 < (int)uVar5) {
                fprintf(_stderr,"%s: `%s\' appears to contain more than %d blocks\n",progName,
                        inFileName,50000);
                fprintf(_stderr,"%s: and cannot be handled.  To fix, increase\n",progName);
                pcVar10 = "%s: BZ_MAX_HANDLED_BLOCKS in bzip2recover.c, and recompile.\n";
                goto LAB_00101975;
              }
              bStart[(long)(int)uVar5 + 1] = uVar17;
              uVar5 = uVar5 + 1;
              iVar2 = iVar15;
            }
            uVar3 = bsGetBit(pBVar9);
          } while (uVar3 != 2);
          uVar13 = uVar13 + 2;
        }
        uVar1 = bStart[(int)uVar5];
        if ((0x27 < uVar13 - uVar1 && uVar1 <= uVar13) &&
           (bEnd[(int)uVar5] = uVar17, 0 < (int)uVar5)) {
          fprintf(_stderr,"   block %d runs from %Lu to %Lu (incomplete)\n",(ulong)uVar5,uVar1,
                  uVar17);
        }
        bsClose(pBVar9);
        if (iVar2 < 1) {
          pcVar10 = "%s: sorry, I couldn\'t find any block boundaries.\n";
LAB_00101975:
          fprintf(_stderr,pcVar10,progName);
          goto LAB_0010197c;
        }
        fprintf(_stderr,"%s: splitting into blocks\n",progName);
        pFVar8 = fopen(inFileName,"rb");
        if (pFVar8 != (FILE *)0x0) {
          pBVar9 = bsOpenReadStream((FILE *)pFVar8);
          uVar5 = bsGetBit(pBVar9);
          if (uVar5 == 2) {
LAB_00101471:
            fprintf(_stderr,"%s: finished\n",progName);
            return 0;
          }
          uVar3 = 0;
          iVar15 = 0;
          bs = (BitStream *)0x0;
          local_50 = (FILE *)0x0;
          uVar13 = 0;
LAB_001014bb:
          local_64 = local_64 << 1 | uVar16 >> 0x1f;
          uVar12 = uVar16 * 2 >> 0x10 | local_64 << 0x10;
          if (uVar13 != rbStart[iVar15] + 0x2f) {
            uVar12 = uVar3;
          }
          uVar3 = uVar12;
          if (((local_50 != (FILE *)0x0) && (rbStart[iVar15] <= uVar13)) &&
             (uVar13 <= rbEnd[iVar15])) {
            bsPutBit(bs,uVar5);
          }
          if (uVar13 != rbEnd[iVar15]) {
            if (uVar13 + 1 == rbStart[iVar15]) {
              memset(outFileName,0,2000);
              strcpy(outFileName,inFileName);
              pcVar10 = strrchr(outFileName,0x2f);
              pCVar14 = pcVar10 + 1;
              if (pcVar10 == (char *)0x0) {
                pCVar14 = outFileName;
              }
              sprintf(pCVar14,"rec%5d");
              pcVar10 = pCVar14;
              do {
                if (*pcVar10 == ' ') {
                  *pcVar10 = '0';
                }
                else if (*pcVar10 == '\0') goto LAB_00101708;
                pcVar10 = pcVar10 + 1;
              } while( true );
            }
            goto LAB_00101662;
          }
          if (local_50 != (FILE *)0x0) {
            uVar12 = 7;
            do {
              bsPutBit(bs,(uint)((0x17U >> (uVar12 & 0x1f) & 1) != 0));
              bVar18 = uVar12 != 0;
              uVar12 = uVar12 - 1;
            } while (bVar18);
            uVar12 = 7;
            do {
              bsPutBit(bs,(uint)((0x72U >> (uVar12 & 0x1f) & 1) != 0));
              bVar18 = uVar12 != 0;
              uVar12 = uVar12 - 1;
            } while (bVar18);
            uVar12 = 7;
            do {
              bsPutBit(bs,(uint)((0x45U >> (uVar12 & 0x1f) & 1) != 0));
              bVar18 = uVar12 != 0;
              uVar12 = uVar12 - 1;
            } while (bVar18);
            uVar12 = 7;
            do {
              bsPutBit(bs,(uint)((0x38U >> (uVar12 & 0x1f) & 1) != 0));
              bVar18 = uVar12 != 0;
              uVar12 = uVar12 - 1;
            } while (bVar18);
            uVar12 = 7;
            do {
              bsPutBit(bs,(uint)((0x50U >> (uVar12 & 0x1f) & 1) != 0));
              bVar18 = uVar12 != 0;
              uVar12 = uVar12 - 1;
            } while (bVar18);
            uVar12 = 7;
            do {
              bsPutBit(bs,(uint)((0x90U >> (uVar12 & 0x1f) & 1) != 0));
              bVar18 = uVar12 != 0;
              uVar12 = uVar12 - 1;
            } while (bVar18);
            uVar12 = 0x1f;
            do {
              bsPutBit(bs,(uint)((uVar3 >> (uVar12 & 0x1f) & 1) != 0));
              bVar18 = uVar12 != 0;
              uVar12 = uVar12 - 1;
            } while (bVar18);
            bsClose(bs);
          }
          if (iVar2 <= iVar15) goto LAB_00101471;
          iVar15 = iVar15 + 1;
          goto LAB_00101662;
        }
        pcVar10 = "%s: can\'t open `%s\'\n";
      }
      pCVar14 = inFileName;
LAB_00101a25:
      fprintf(_stderr,pcVar10,progName,pCVar14);
    }
    else {
      fprintf(_stderr,"%s: supplied filename is suspiciously (>= %d chars) long.  Bye!\n",progName,
              sVar7 & 0xffffffff);
    }
  }
  else {
    fprintf(_stderr,"%s: usage is `%s damaged_file_name\'.\n",progName);
    fwrite("\trestrictions on size of recovered file: None\n",0x2e,1,_stderr);
  }
LAB_0010197c:
  exit(1);
LAB_00101708:
  strcat(outFileName,inFileName + ((int)pCVar14 + -0x1048b0));
  sVar7 = strlen(outFileName);
  iVar6 = (int)sVar7;
  if (((iVar6 < 5) || (outFileName[iVar6 - 4] != '.')) ||
     ((outFileName[iVar6 - 3] != 'b' ||
      ((outFileName[iVar6 - 2] != 'z' || (outFileName[iVar6 - 1] != '2')))))) {
    sVar7 = strlen(outFileName);
    builtin_memcpy(outFileName + sVar7,".bz2",4);
    outFileName[sVar7 + 4] = '\0';
  }
  fprintf(_stderr,"   writing block %d to `%s\' ...\n",iVar15 + 1,outFileName);
  local_50 = fopen(outFileName,"wb");
  if (local_50 == (FILE *)0x0) {
    pcVar10 = "%s: can\'t write `%s\'\n";
    pCVar14 = outFileName;
    goto LAB_00101a25;
  }
  n = 0x18;
  bs = (BitStream *)malloc(0x18);
  if (bs == (BitStream *)0x0) {
    mallocFail(n);
  }
  bs->handle = (FILE *)local_50;
  bs->buffer = 0;
  bs->buffLive = 0;
  bs->mode = 'w';
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x42U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x5aU >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x68U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x39U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x31U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x41U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x59U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x26U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x53U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
  uVar12 = 7;
  do {
    bsPutBit(bs,(uint)((0x59U >> (uVar12 & 0x1f) & 1) != 0));
    bVar18 = uVar12 != 0;
    uVar12 = uVar12 - 1;
  } while (bVar18);
LAB_00101662:
  uVar16 = (uVar5 & 1) + uVar16 * 2;
  uVar5 = bsGetBit(pBVar9);
  uVar13 = uVar13 + 1;
  if (uVar5 == 2) goto LAB_00101471;
  goto LAB_001014bb;
}

Assistant:

Int32 main ( Int32 argc, Char** argv )
{
   FILE*       inFile;
   FILE*       outFile;
   BitStream*  bsIn, *bsWr;
   Int32       b, wrBlock, currBlock, rbCtr;
   MaybeUInt64 bitsRead;

   UInt32      buffHi, buffLo, blockCRC;
   Char*       p;

   strncpy ( progName, argv[0], BZ_MAX_FILENAME-1);
   progName[BZ_MAX_FILENAME-1]='\0';
   inFileName[0] = outFileName[0] = 0;

   fprintf ( stderr, 
             "bzip2recover 1.0.6: extracts blocks from damaged .bz2 files.\n" );

   if (argc != 2) {
      fprintf ( stderr, "%s: usage is `%s damaged_file_name'.\n",
                        progName, progName );
      switch (sizeof(MaybeUInt64)) {
         case 8:
            fprintf(stderr, 
                    "\trestrictions on size of recovered file: None\n");
            break;
         case 4:
            fprintf(stderr, 
                    "\trestrictions on size of recovered file: 512 MB\n");
            fprintf(stderr, 
                    "\tto circumvent, recompile with MaybeUInt64 as an\n"
                    "\tunsigned 64-bit int.\n");
            break;
         default:
            fprintf(stderr, 
                    "\tsizeof(MaybeUInt64) is not 4 or 8 -- "
                    "configuration error.\n");
            break;
      }
      exit(1);
   }

   if (strlen(argv[1]) >= BZ_MAX_FILENAME-20) {
      fprintf ( stderr, 
                "%s: supplied filename is suspiciously (>= %d chars) long.  Bye!\n",
                progName, (int)strlen(argv[1]) );
      exit(1);
   }

   strcpy ( inFileName, argv[1] );

   inFile = fopen ( inFileName, "rb" );
   if (inFile == NULL) {
      fprintf ( stderr, "%s: can't read `%s'\n", progName, inFileName );
      exit(1);
   }

   bsIn = bsOpenReadStream ( inFile );
   fprintf ( stderr, "%s: searching for block boundaries ...\n", progName );

   bitsRead = 0;
   buffHi = buffLo = 0;
   currBlock = 0;
   bStart[currBlock] = 0;

   rbCtr = 0;

   while (True) {
      b = bsGetBit ( bsIn );
      bitsRead++;
      if (b == 2) {
         if (bitsRead >= bStart[currBlock] &&
            (bitsRead - bStart[currBlock]) >= 40) {
            bEnd[currBlock] = bitsRead-1;
            if (currBlock > 0)
               fprintf ( stderr, "   block %d runs from " MaybeUInt64_FMT 
                                 " to " MaybeUInt64_FMT " (incomplete)\n",
                         currBlock,  bStart[currBlock], bEnd[currBlock] );
         } else
            currBlock--;
         break;
      }
      buffHi = (buffHi << 1) | (buffLo >> 31);
      buffLo = (buffLo << 1) | (b & 1);
      if ( ( (buffHi & 0x0000ffff) == BLOCK_HEADER_HI 
             && buffLo == BLOCK_HEADER_LO)
           || 
           ( (buffHi & 0x0000ffff) == BLOCK_ENDMARK_HI 
             && buffLo == BLOCK_ENDMARK_LO)
         ) {
         if (bitsRead > 49) {
            bEnd[currBlock] = bitsRead-49;
         } else {
            bEnd[currBlock] = 0;
         }
         if (currBlock > 0 &&
	     (bEnd[currBlock] - bStart[currBlock]) >= 130) {
            fprintf ( stderr, "   block %d runs from " MaybeUInt64_FMT 
                              " to " MaybeUInt64_FMT "\n",
                      rbCtr+1,  bStart[currBlock], bEnd[currBlock] );
            rbStart[rbCtr] = bStart[currBlock];
            rbEnd[rbCtr] = bEnd[currBlock];
            rbCtr++;
         }
         if (currBlock >= BZ_MAX_HANDLED_BLOCKS)
            tooManyBlocks(BZ_MAX_HANDLED_BLOCKS);
         currBlock++;

         bStart[currBlock] = bitsRead;
      }
   }

   bsClose ( bsIn );

   /*-- identified blocks run from 1 to rbCtr inclusive. --*/

   if (rbCtr < 1) {
      fprintf ( stderr,
                "%s: sorry, I couldn't find any block boundaries.\n",
                progName );
      exit(1);
   };

   fprintf ( stderr, "%s: splitting into blocks\n", progName );

   inFile = fopen ( inFileName, "rb" );
   if (inFile == NULL) {
      fprintf ( stderr, "%s: can't open `%s'\n", progName, inFileName );
      exit(1);
   }
   bsIn = bsOpenReadStream ( inFile );

   /*-- placate gcc's dataflow analyser --*/
   blockCRC = 0; bsWr = 0;

   bitsRead = 0;
   outFile = NULL;
   wrBlock = 0;
   while (True) {
      b = bsGetBit(bsIn);
      if (b == 2) break;
      buffHi = (buffHi << 1) | (buffLo >> 31);
      buffLo = (buffLo << 1) | (b & 1);
      if (bitsRead == 47+rbStart[wrBlock]) 
         blockCRC = (buffHi << 16) | (buffLo >> 16);

      if (outFile != NULL && bitsRead >= rbStart[wrBlock]
                          && bitsRead <= rbEnd[wrBlock]) {
         bsPutBit ( bsWr, b );
      }

      bitsRead++;

      if (bitsRead == rbEnd[wrBlock]+1) {
         if (outFile != NULL) {
            bsPutUChar ( bsWr, 0x17 ); bsPutUChar ( bsWr, 0x72 );
            bsPutUChar ( bsWr, 0x45 ); bsPutUChar ( bsWr, 0x38 );
            bsPutUChar ( bsWr, 0x50 ); bsPutUChar ( bsWr, 0x90 );
            bsPutUInt32 ( bsWr, blockCRC );
            bsClose ( bsWr );
         }
         if (wrBlock >= rbCtr) break;
         wrBlock++;
      } else
      if (bitsRead == rbStart[wrBlock]) {
         /* Create the output file name, correctly handling leading paths. 
            (31.10.2001 by Sergey E. Kusikov) */
         Char* split;
         Int32 ofs, k;
         for (k = 0; k < BZ_MAX_FILENAME; k++) 
            outFileName[k] = 0;
         strcpy (outFileName, inFileName);
         split = strrchr (outFileName, BZ_SPLIT_SYM);
         if (split == NULL) {
            split = outFileName;
         } else {
            ++split;
	 }
	 /* Now split points to the start of the basename. */
         ofs  = split - outFileName;
         sprintf (split, "rec%5d", wrBlock+1);
         for (p = split; *p != 0; p++) if (*p == ' ') *p = '0';
         strcat (outFileName, inFileName + ofs);

         if ( !endsInBz2(outFileName)) strcat ( outFileName, ".bz2" );

         fprintf ( stderr, "   writing block %d to `%s' ...\n",
                           wrBlock+1, outFileName );

         outFile = fopen ( outFileName, "wb" );
         if (outFile == NULL) {
            fprintf ( stderr, "%s: can't write `%s'\n",
                      progName, outFileName );
            exit(1);
         }
         bsWr = bsOpenWriteStream ( outFile );
         bsPutUChar ( bsWr, BZ_HDR_B );    
         bsPutUChar ( bsWr, BZ_HDR_Z );    
         bsPutUChar ( bsWr, BZ_HDR_h );    
         bsPutUChar ( bsWr, BZ_HDR_0 + 9 );
         bsPutUChar ( bsWr, 0x31 ); bsPutUChar ( bsWr, 0x41 );
         bsPutUChar ( bsWr, 0x59 ); bsPutUChar ( bsWr, 0x26 );
         bsPutUChar ( bsWr, 0x53 ); bsPutUChar ( bsWr, 0x59 );
      }
   }

   fprintf ( stderr, "%s: finished\n", progName );
   return 0;
}